

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O2

const_iterator __thiscall
ArgumentParser::KeywordActionMap::Find(KeywordActionMap *this,string_view name)

{
  bool bVar1;
  const_iterator cVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  *ppVar5;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  ppVar5 = (this->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->
                 super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 ).
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) / 0x30;
  while (uVar4 = uVar3, 0 < (long)uVar4) {
    uVar3 = uVar4 >> 1;
    __x._M_str = ppVar5[uVar3].first._M_str;
    __x._M_len = ppVar5[uVar3].first._M_len;
    bVar1 = std::operator<(__x,name);
    if (bVar1) {
      ppVar5 = ppVar5 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar4;
    }
  }
  cVar2._M_current =
       (this->
       super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
       ).
       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppVar5 != cVar2._M_current) &&
     (bVar1 = std::operator==(ppVar5->first,name), cVar2._M_current = ppVar5, !bVar1)) {
    cVar2._M_current =
         (this->
         super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
         ).
         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  return (const_iterator)cVar2._M_current;
}

Assistant:

auto KeywordActionMap::Find(cm::string_view name) const -> const_iterator
{
  auto const it =
    std::lower_bound(this->begin(), this->end(), name,
                     [](value_type const& elem, cm::string_view const& k) {
                       return elem.first < k;
                     });
  return (it != this->end() && it->first == name) ? it : this->end();
}